

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QList<QModelIndex> * __thiscall
QListModeViewBase::intersectingSet(QListModeViewBase *this,QRect *area)

{
  bool bVar1;
  Flow FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  const_reference piVar7;
  int *piVar8;
  QCommonListViewBase *in_RSI;
  QList<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  int endPos;
  int startPos;
  int iw;
  int row;
  int last;
  int first;
  int seg;
  int segLast;
  int flowEndPosition;
  QList<QModelIndex> *ret;
  QListViewItem viewItem;
  QModelIndex index;
  int flowStartPosition;
  int segEndPosition;
  int segStartPosition;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff48;
  int iVar10;
  uint in_stack_ffffffffffffff4c;
  QList<QModelIndex> *pQVar11;
  int local_88;
  int local_7c;
  int local_70;
  undefined1 local_4c [16];
  uint local_3c;
  QFlagsStorage<Qt::AlignmentFlag> local_38;
  QFlagsStorage<Qt::AlignmentFlag> local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = in_RDI;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x883ffc);
  local_c = -0x55555556;
  local_10 = -0x55555556;
  local_14 = 0xaaaaaaaa;
  FVar2 = QCommonListViewBase::flow(in_RSI);
  if (FVar2 == LeftToRight) {
    local_c = QRect::top((QRect *)0x88403e);
    local_10 = QRect::bottom((QRect *)0x88404f);
    local_14 = QRect::left((QRect *)0x884060);
    local_70 = QRect::right((QRect *)0x884071);
  }
  else {
    local_c = QRect::left((QRect *)0x884081);
    local_10 = QRect::right((QRect *)0x884092);
    local_14 = QRect::top((QRect *)0x8840a3);
    local_70 = QRect::bottom((QRect *)0x8840b4);
  }
  qVar6 = QList<int>::size((QList<int> *)&in_RSI[1].contentsSize);
  if ((1 < qVar6) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x8840da), !bVar1)) {
    qVar6 = QList<int>::size((QList<int> *)&in_RSI[1].contentsSize);
    iVar3 = (int)qVar6 + -2;
    local_7c = qBinarySearch<int>((QList<int> *)in_RDI,
                                  (int *)CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48),
                                  in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
    while( true ) {
      in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c & 0xffffff;
      if (local_7c <= iVar3) {
        piVar7 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        in_stack_ffffffffffffff4c = CONCAT13(*piVar7 <= local_10,(int3)in_stack_ffffffffffffff4c);
      }
      if ((char)(in_stack_ffffffffffffff4c >> 0x18) == '\0') break;
      QList<int>::at((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (local_7c < iVar3) {
        piVar7 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        iVar10 = *piVar7;
      }
      else {
        iVar10 = in_RSI->batchStartRow;
      }
      iVar4 = iVar10 + -1;
      piVar7 = QList<int>::at((QList<int> *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (local_14 <= *piVar7) {
        local_88 = qBinarySearch<int>((QList<int> *)in_RDI,
                                      (int *)CONCAT44(in_stack_ffffffffffffff4c,iVar10),
                                      in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
        while( true ) {
          uVar9 = in_stack_ffffffffffffff44 & 0xffffff;
          if (local_88 <= iVar4) {
            piVar7 = QList<int>::at((QList<int> *)
                                    (CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40) &
                                    0xffffffffffffff),
                                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            uVar9 = CONCAT13(*piVar7 <= local_70,(int3)uVar9);
          }
          in_stack_ffffffffffffff44 = uVar9;
          if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') break;
          bVar1 = QCommonListViewBase::isHidden
                            ((QCommonListViewBase *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             in_stack_ffffffffffffff3c);
          if (!bVar1) {
            local_30 = &DAT_aaaaaaaaaaaaaaaa;
            local_28 = &DAT_aaaaaaaaaaaaaaaa;
            local_20 = &DAT_aaaaaaaaaaaaaaaa;
            QCommonListViewBase::modelIndex(in_RSI,(int)((ulong)pQVar11 >> 0x20));
            bVar1 = QModelIndex::isValid
                              ((QModelIndex *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (bVar1) {
              FVar2 = QCommonListViewBase::flow(in_RSI);
              if (FVar2 != LeftToRight) {
                local_34.i = (in_RSI->dd->itemAlignment).
                             super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                             super_QFlagsStorage<Qt::AlignmentFlag>.i;
                memset(&local_38,0,4);
                QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x8842ff);
                bVar1 = ::operator==((QFlags<Qt::AlignmentFlag>)local_34.i,
                                     (QFlags<Qt::AlignmentFlag>)local_38.i);
                if (!bVar1) {
                  local_4c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_4c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_3c = 0xaaaaaaaa;
                  (*in_RSI->_vptr_QCommonListViewBase[3])(local_4c,in_RSI,&local_30);
                  iVar5 = QListViewItem::width((QListViewItem *)local_4c);
                  piVar7 = QList<int>::at((QList<int> *)
                                          CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                          CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38));
                  piVar8 = qMax<int>(&local_c,piVar7);
                  iVar10 = *piVar8;
                  piVar7 = QList<int>::at((QList<int> *)
                                          CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                          CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38));
                  piVar8 = qMin<int>(piVar7,&local_10);
                  if (((int)local_4c._0_4_ <= *piVar8) && (iVar10 < local_4c._0_4_ + iVar5)) {
                    QList<QModelIndex>::operator+=
                              ((QList<QModelIndex> *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (parameter_type)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
                  }
                  goto LAB_00884406;
                }
              }
              QList<QModelIndex>::operator+=
                        ((QList<QModelIndex> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (parameter_type)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            }
          }
LAB_00884406:
          local_88 = local_88 + 1;
        }
      }
      local_7c = local_7c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar11;
  }
  __stack_chk_fail();
}

Assistant:

QList<QModelIndex> QListModeViewBase::intersectingSet(const QRect &area) const
{
    QList<QModelIndex> ret;
    int segStartPosition;
    int segEndPosition;
    int flowStartPosition;
    int flowEndPosition;
    if (flow() == QListView::LeftToRight) {
        segStartPosition = area.top();
        segEndPosition = area.bottom();
        flowStartPosition = area.left();
        flowEndPosition = area.right();
    } else {
        segStartPosition = area.left();
        segEndPosition = area.right();
        flowStartPosition = area.top();
        flowEndPosition = area.bottom();
    }
    if (segmentPositions.size() < 2 || flowPositions.isEmpty())
        return ret;
    // the last segment position is actually the edge of the last segment
    const int segLast = segmentPositions.size() - 2;
    int seg = qBinarySearch<int>(segmentPositions, segStartPosition, 0, segLast + 1);
    for (; seg <= segLast && segmentPositions.at(seg) <= segEndPosition; ++seg) {
        int first = segmentStartRows.at(seg);
        int last = (seg < segLast ? segmentStartRows.at(seg + 1) : batchStartRow) - 1;
        if (segmentExtents.at(seg) < flowStartPosition)
            continue;
        int row = qBinarySearch<int>(flowPositions, flowStartPosition, first, last);
        for (; row <= last && flowPositions.at(row) <= flowEndPosition; ++row) {
            if (isHidden(row))
                continue;
            QModelIndex index = modelIndex(row);
            if (index.isValid()) {
                if (flow() == QListView::LeftToRight || dd->itemAlignment == Qt::Alignment()) {
                    ret += index;
                } else {
                    const auto viewItem = indexToListViewItem(index);
                    const int iw = viewItem.width();
                    const int startPos = qMax(segStartPosition, segmentPositions.at(seg));
                    const int endPos = qMin(segmentPositions.at(seg + 1), segEndPosition);
                    if (endPos >= viewItem.x && startPos < viewItem.x + iw)
                        ret += index;
                }
            }
#if 0 // for debugging
            else
                qWarning("intersectingSet: row %d was invalid", row);
#endif
        }
    }
    return ret;
}